

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O2

bool __thiscall
iutest::floating_point<float>::NanSensitiveAlmostEquals(floating_point<float> *this,_Myt *rhs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (this->m_v).iv;
  uVar1 = uVar3 | 0x80000000;
  if ((int)uVar3 < 0) {
    uVar1 = -uVar3;
  }
  uVar3 = (rhs->m_v).iv;
  uVar2 = uVar3 | 0x80000000;
  if ((int)uVar3 < 0) {
    uVar2 = -uVar3;
  }
  uVar3 = uVar2 - uVar1;
  if (uVar2 < uVar1) {
    uVar3 = -(uVar2 - uVar1);
  }
  return uVar3 < 5;
}

Assistant:

UInt    enable_bits() const { return m_v.uv & kEnableBitMask; }